

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

void __thiscall
testing::ScopedTrace::ScopedTrace(ScopedTrace *this,char *file,int line,string *message)

{
  pointer pcVar1;
  string local_50;
  
  pcVar1 = (message->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + message->_M_string_length);
  PushTrace(this,file,line,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ScopedTrace(const char* file, int line, const std::string& message) {
    PushTrace(file, line, message);
  }